

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

reference andres::marray_detail::AccessOperatorHelper<false>::
          execute<int,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,true,std::allocator<unsigned_long>>
                    (View<int,_true,_std::allocator<unsigned_long>_> *v,
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    it)

{
  size_t sVar1;
  reference puVar2;
  bool local_29;
  size_t local_20;
  size_t offset;
  View<int,_true,_std::allocator<unsigned_long>_> *v_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it_local;
  
  offset = (size_t)v;
  v_local = (View<int,_true,_std::allocator<unsigned_long>_> *)it._M_current;
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(v);
  Assert<bool>(*(long *)offset != 0);
  sVar1 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)offset);
  local_29 = true;
  if (sVar1 == 0) {
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&v_local);
    local_29 = *puVar2 == 0;
  }
  Assert<bool>(local_29);
  View<int,true,std::allocator<unsigned_long>>::
  coordinatesToOffset<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)offset,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )v_local,&local_20);
  return (reference)(*(long *)offset + local_20 * 4);
}

Assistant:

static typename View<T, isConst, A>::reference
    execute(const View<T, isConst, A>& v, U it)
    {
        v.testInvariant();
        Assert(MARRAY_NO_DEBUG || v.data_ != 0);
        Assert(MARRAY_NO_DEBUG || v.dimension() != 0 || *it == 0);
        std::size_t offset;
        v.coordinatesToOffset(it, offset);
        return v.data_[offset];
    }